

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

void __thiscall Js::ProbeContainer::Initialize(ProbeContainer *this,ScriptContext *pScriptContext)

{
  ArenaAllocator *alloc;
  List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *addr;
  
  if (this->diagProbeList != (ProbeList *)0x0) {
    return;
  }
  alloc = ScriptContext::AllocatorForDiagnostics(pScriptContext);
  pLVar1 = JsUtil::
           List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
           New(alloc,4);
  this->diagProbeList = pLVar1;
  pLVar1 = JsUtil::
           List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
           New(alloc,4);
  this->pendingProbeList = pLVar1;
  this->pScriptContext = pScriptContext;
  this->debugManager = pScriptContext->threadContext->debugManager;
  addr = JsUtil::
         List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         ::New(pScriptContext->recycler,4);
  this->pinnedPropertyRecords = addr;
  ScriptContext::BindReference(this->pScriptContext,addr);
  return;
}

Assistant:

void ProbeContainer::Initialize(ScriptContext* pScriptContext)
    {
        if (!diagProbeList)
        {
            ArenaAllocator* global = pScriptContext->AllocatorForDiagnostics();

            diagProbeList = ProbeList::New(global);

            pendingProbeList = ProbeList::New(global);

            this->pScriptContext = pScriptContext;
            this->debugManager = this->pScriptContext->GetThreadContext()->GetDebugManager();
            this->pinnedPropertyRecords = JsUtil::List<const Js::PropertyRecord*>::New(this->pScriptContext->GetRecycler());
            this->pScriptContext->BindReference((void *)this->pinnedPropertyRecords);
        }
    }